

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::doJSONPages(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  undefined8 uVar1;
  pointer pQVar2;
  bool bVar3;
  int iVar4;
  pointer this_00;
  long lVar5;
  _Base_ptr p_Var6;
  QPDFObjGen og;
  undefined1 auVar7 [8];
  pointer this_01;
  int json_version;
  int i;
  int iVar8;
  allocator<char> local_2d2;
  bool first_page;
  QPDFObjectHandle decode_parms;
  string local_2b8;
  QPDFObjectHandle dict;
  JSON j_contents;
  undefined1 local_278 [8];
  _Rb_tree_node_base local_270;
  QPDFObjectHandle dp_array;
  JSON j_outlines;
  JSON j_page;
  QPDFObjectHandle local_210;
  long local_200;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> outlines;
  JSON j_images;
  QPDFObjectHandle page;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_198;
  QPDFPageLabelDocumentHelper pldh;
  JSON local_160;
  JSON local_150;
  JSON local_140;
  JSON local_130;
  JSON local_120;
  JSON local_110;
  JSON local_100;
  JSON local_f0;
  JSON local_e0;
  JSON local_d0;
  JSON local_c0;
  JSON local_b0;
  JSON local_a0;
  JSON local_90;
  JSON local_80;
  JSON local_70;
  JSON local_60;
  QPDFOutlineDocumentHelper odh;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_278,"pages",(allocator<char> *)&pldh);
  JSON::writeDictionaryKey(p,first,(string *)local_278,1);
  std::__cxx11::string::~string((string *)local_278);
  first_page = true;
  JSON::writeArrayOpen(p,&first_page,2);
  QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper(&pldh,pdf);
  QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper(&odh,pdf);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_278,pdf);
  QPDFPageDocumentHelper::getAllPages(&local_198,(QPDFPageDocumentHelper *)local_278);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_278);
  local_200 = -1;
  this_00 = local_198.
            super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (this_00 ==
        local_198.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
        _M_impl.super__Vector_impl_data._M_finish) break;
    JSON::makeDictionary();
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
               &(this_00->super_QPDFObjectHelper).super_BaseHandle);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_278,"object",(allocator<char> *)&outlines);
    QPDFObjectHandle::getJSON
              ((QPDFObjectHandle *)&local_2b8,
               (int)(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page,
               SUB41(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->json_version,0));
    JSON::addDictionaryMember(&local_60,(string *)&j_page,(JSON *)local_278);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2b8._M_string_length);
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_278,"images",(allocator<char> *)&outlines);
    JSON::makeArray();
    JSON::addDictionaryMember(&j_images,(string *)&j_page,(JSON *)local_278);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2b8._M_string_length);
    std::__cxx11::string::~string((string *)local_278);
    QPDFPageObjectHelper::getImages_abi_cxx11_
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                *)local_278,this_00);
    lVar5 = local_200 + 1;
    for (p_Var6 = local_270._M_left; iVar8 = (int)(string *)&outlines,
        p_Var6 != (_Rb_tree_node_base *)(local_278 + 8);
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      JSON::makeDictionary();
      JSON::addArrayElement(&j_contents,&j_images);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2b8._M_string_length);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"name",(allocator<char> *)&j_outlines);
      JSON::makeString((string *)&outlines);
      JSON::addDictionaryMember(&local_70,(string *)&j_contents,(JSON *)&local_2b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_70.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &outlines.
                  super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&j_outlines,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(p_Var6 + 2));
      QPDFObjectHandle::getDict(&dict);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"object",(allocator<char> *)&decode_parms);
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)&outlines,(int)&j_outlines,
                 SUB41(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->json_version,0));
      JSON::addDictionaryMember(&local_80,(string *)&j_contents,(JSON *)&local_2b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_80.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &outlines.
                  super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"width",(allocator<char> *)&local_210);
      std::__cxx11::string::string<std::allocator<char>>((string *)&outlines,"/Width",&local_2d2);
      QPDFObjectHandle::getKey(&dp_array,(string *)&dict);
      json_version = (int)(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&dp_array;
      QPDFObjectHandle::getJSON
                (&decode_parms,json_version,
                 SUB41(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->json_version,0));
      JSON::addDictionaryMember(&local_90,(string *)&j_contents,(JSON *)&local_2b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&decode_parms.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dp_array.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&outlines);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"height",(allocator<char> *)&local_210);
      std::__cxx11::string::string<std::allocator<char>>((string *)&outlines,"/Height",&local_2d2);
      QPDFObjectHandle::getKey(&dp_array,(string *)&dict);
      QPDFObjectHandle::getJSON
                (&decode_parms,json_version,
                 SUB41(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->json_version,0));
      JSON::addDictionaryMember(&local_a0,(string *)&j_contents,(JSON *)&local_2b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_a0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&decode_parms.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dp_array.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&outlines);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"colorspace",(allocator<char> *)&local_210);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&outlines,"/ColorSpace",&local_2d2);
      QPDFObjectHandle::getKey(&dp_array,(string *)&dict);
      QPDFObjectHandle::getJSON
                (&decode_parms,json_version,
                 SUB41(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->json_version,0));
      JSON::addDictionaryMember(&local_b0,(string *)&j_contents,(JSON *)&local_2b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&decode_parms.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dp_array.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&outlines);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"bitspercomponent",(allocator<char> *)&local_210);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&outlines,"/BitsPerComponent",&local_2d2);
      QPDFObjectHandle::getKey(&dp_array,(string *)&dict);
      QPDFObjectHandle::getJSON
                (&decode_parms,json_version,
                 SUB41(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->json_version,0));
      JSON::addDictionaryMember(&local_c0,(string *)&j_contents,(JSON *)&local_2b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_c0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&decode_parms.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dp_array.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&outlines);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"/Filter",(allocator<char> *)&dp_array);
      QPDFObjectHandle::getKey(&decode_parms,(string *)&dict);
      QPDFObjectHandle::wrapInArray((QPDFObjectHandle *)&outlines);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&decode_parms.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"filter",(allocator<char> *)&dp_array);
      QPDFObjectHandle::getJSON
                (&decode_parms,iVar8,
                 SUB41(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->json_version,0));
      JSON::addDictionaryMember(&local_d0,(string *)&j_contents,(JSON *)&local_2b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_d0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&decode_parms.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"/DecodeParms",(allocator<char> *)&dp_array);
      QPDFObjectHandle::getKey(&decode_parms,(string *)&dict);
      std::__cxx11::string::~string((string *)&local_2b8);
      dp_array.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      dp_array.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      bVar3 = QPDFObjectHandle::isArray(&decode_parms);
      if (bVar3) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&dp_array,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&decode_parms);
      }
      else {
        QPDFObjectHandle::newArray();
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&dp_array,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_2b8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2b8._M_string_length);
        iVar8 = 0;
        while( true ) {
          iVar4 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)&outlines);
          if (iVar4 <= iVar8) break;
          QPDFObjectHandle::appendItem(&dp_array,&decode_parms);
          iVar8 = iVar8 + 1;
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"decodeparms",&local_2d2);
      QPDFObjectHandle::getJSON
                (&local_210,json_version,
                 SUB41(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->json_version,0));
      JSON::addDictionaryMember(&local_e0,(string *)&j_contents,(JSON *)&local_2b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_210.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"filterable",&local_2d2);
      QPDFObjectHandle::pipeStreamData
                ((QPDFObjectHandle *)&j_outlines,(Pipeline *)0x0,0,
                 ((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->decode_level,true,false);
      JSON::makeBool(false);
      JSON::addDictionaryMember(&local_f0,(string *)&j_contents,(JSON *)&local_2b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_f0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_210.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dp_array.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&decode_parms.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &outlines.
                  super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&j_outlines.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&j_contents.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                 *)local_278);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_278,"images",(allocator<char> *)&local_2b8);
    JSON::addDictionaryMember(&local_100,(string *)&j_page,(JSON *)local_278);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_100.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_278,"contents",(allocator<char> *)&outlines);
    JSON::makeArray();
    JSON::addDictionaryMember(&j_contents,(string *)&j_page,(JSON *)local_278);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2b8._M_string_length);
    std::__cxx11::string::~string((string *)local_278);
    QPDFPageObjectHelper::getPageContents
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_278,this_00);
    uVar1 = local_270._0_8_;
    for (auVar7 = local_278; auVar7 != (undefined1  [8])uVar1;
        auVar7 = (undefined1  [8])((long)auVar7 + 0x10)) {
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)&local_2b8,SUB84(auVar7,0),
                 SUB41(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->json_version,0));
      JSON::addArrayElement(&local_110,&j_contents);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_110.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2b8._M_string_length);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_278);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_278,"label",(allocator<char> *)&j_outlines);
    QPDFPageLabelDocumentHelper::getLabelForPage
              ((QPDFPageLabelDocumentHelper *)&outlines,(longlong)&pldh);
    QPDFObjectHandle::getJSON
              ((QPDFObjectHandle *)&local_2b8,iVar8,
               SUB41(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->json_version,0));
    JSON::addDictionaryMember(&local_120,(string *)&j_page,(JSON *)local_278);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_120.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2b8._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &outlines.
                super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_278,"outlines",(allocator<char> *)&outlines);
    JSON::makeArray();
    JSON::addDictionaryMember(&j_outlines,(string *)&j_page,(JSON *)local_278);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2b8._M_string_length);
    std::__cxx11::string::~string((string *)local_278);
    og = QPDFObjectHandle::getObjGen(&page);
    QPDFOutlineDocumentHelper::getOutlinesForPage(&outlines,&odh,og);
    pQVar2 = outlines.
             super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (this_01 = outlines.
                   super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_01 != pQVar2;
        this_01 = this_01 + 1) {
      JSON::makeDictionary();
      JSON::addArrayElement((JSON *)&dict,&j_outlines);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_278 + 8));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_278,"object",(allocator<char> *)&dp_array);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&decode_parms,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 &(this_01->super_QPDFObjectHelper).super_BaseHandle);
      iVar8 = (int)(QPDFOutlineObjectHelper *)&decode_parms;
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)&local_2b8,iVar8,
                 SUB41(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->json_version,0));
      JSON::addDictionaryMember(&local_130,(string *)&dict,(JSON *)local_278);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_130.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2b8._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&decode_parms.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)local_278);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_278,"title",(allocator<char> *)&dp_array);
      QPDFOutlineObjectHelper::getTitle_abi_cxx11_(&local_2b8,this_01);
      JSON::makeString((string *)&decode_parms);
      JSON::addDictionaryMember(&local_140,(string *)&dict,(JSON *)local_278);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_140.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&decode_parms.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)local_278);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_278,"dest",(allocator<char> *)&dp_array);
      QPDFOutlineObjectHelper::getDest((QPDFOutlineObjectHelper *)&decode_parms);
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)&local_2b8,iVar8,
                 SUB41(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->json_version,0));
      JSON::addDictionaryMember(&local_150,(string *)&dict,(JSON *)local_278);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_150.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2b8._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&decode_parms.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)local_278);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_278,"pageposfrom1",(allocator<char> *)&dict);
    JSON::makeInt((longlong)this);
    JSON::addDictionaryMember(&local_160,(string *)&j_page,(JSON *)local_278);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_160.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2b8._M_string_length);
    std::__cxx11::string::~string((string *)local_278);
    JSON::writeArrayItem(p,&first_page,&j_page,2);
    std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
              (&outlines);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&j_outlines.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&j_contents.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&j_images.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&j_page.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    this_00 = this_00 + 1;
    local_200 = lVar5;
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_198);
  JSON::writeArrayClose(p,first_page,1);
  QPDFOutlineDocumentHelper::~QPDFOutlineDocumentHelper(&odh);
  QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper(&pldh);
  return;
}

Assistant:

void
QPDFJob::doJSONPages(Pipeline* p, bool& first, QPDF& pdf)
{
    JSON::writeDictionaryKey(p, first, "pages", 1);
    bool first_page = true;
    JSON::writeArrayOpen(p, first_page, 2);
    QPDFPageLabelDocumentHelper pldh(pdf);
    QPDFOutlineDocumentHelper odh(pdf);
    int pageno = -1;
    for (auto& ph: QPDFPageDocumentHelper(pdf).getAllPages()) {
        ++pageno;
        JSON j_page = JSON::makeDictionary();
        QPDFObjectHandle page = ph.getObjectHandle();
        j_page.addDictionaryMember("object", page.getJSON(m->json_version));
        JSON j_images = j_page.addDictionaryMember("images", JSON::makeArray());
        for (auto const& iter2: ph.getImages()) {
            JSON j_image = j_images.addArrayElement(JSON::makeDictionary());
            j_image.addDictionaryMember("name", JSON::makeString(iter2.first));
            QPDFObjectHandle image = iter2.second;
            QPDFObjectHandle dict = image.getDict();
            j_image.addDictionaryMember("object", image.getJSON(m->json_version));
            j_image.addDictionaryMember("width", dict.getKey("/Width").getJSON(m->json_version));
            j_image.addDictionaryMember("height", dict.getKey("/Height").getJSON(m->json_version));
            j_image.addDictionaryMember(
                "colorspace", dict.getKey("/ColorSpace").getJSON(m->json_version));
            j_image.addDictionaryMember(
                "bitspercomponent", dict.getKey("/BitsPerComponent").getJSON(m->json_version));
            QPDFObjectHandle filters = dict.getKey("/Filter").wrapInArray();
            j_image.addDictionaryMember("filter", filters.getJSON(m->json_version));
            QPDFObjectHandle decode_parms = dict.getKey("/DecodeParms");
            QPDFObjectHandle dp_array;
            if (decode_parms.isArray()) {
                dp_array = decode_parms;
            } else {
                dp_array = QPDFObjectHandle::newArray();
                for (int i = 0; i < filters.getArrayNItems(); ++i) {
                    dp_array.appendItem(decode_parms);
                }
            }
            j_image.addDictionaryMember("decodeparms", dp_array.getJSON(m->json_version));
            j_image.addDictionaryMember(
                "filterable",
                JSON::makeBool(image.pipeStreamData(nullptr, 0, m->decode_level, true)));
        }
        j_page.addDictionaryMember("images", j_images);
        JSON j_contents = j_page.addDictionaryMember("contents", JSON::makeArray());
        for (auto& iter2: ph.getPageContents()) {
            j_contents.addArrayElement(iter2.getJSON(m->json_version));
        }
        j_page.addDictionaryMember("label", pldh.getLabelForPage(pageno).getJSON(m->json_version));
        JSON j_outlines = j_page.addDictionaryMember("outlines", JSON::makeArray());
        std::vector<QPDFOutlineObjectHelper> outlines = odh.getOutlinesForPage(page.getObjGen());
        for (auto& oiter: outlines) {
            JSON j_outline = j_outlines.addArrayElement(JSON::makeDictionary());
            j_outline.addDictionaryMember(
                "object", oiter.getObjectHandle().getJSON(m->json_version));
            j_outline.addDictionaryMember("title", JSON::makeString(oiter.getTitle()));
            j_outline.addDictionaryMember("dest", oiter.getDest().getJSON(m->json_version, true));
        }
        j_page.addDictionaryMember("pageposfrom1", JSON::makeInt(1 + pageno));
        JSON::writeArrayItem(p, first_page, j_page, 2);
    }
    JSON::writeArrayClose(p, first_page, 1);
}